

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.c
# Opt level: O2

int nn_global_hold_socket(nn_sock **sockp,int s)

{
  int iVar1;
  
  nn_mutex_lock(&self.lock);
  iVar1 = nn_global_hold_socket_locked(sockp,s);
  nn_mutex_unlock(&self.lock);
  return iVar1;
}

Assistant:

int nn_global_hold_socket(struct nn_sock **sockp, int s)
{
    int rc;
    nn_mutex_lock(&self.lock);
    rc = nn_global_hold_socket_locked(sockp, s);
    nn_mutex_unlock(&self.lock);
    return rc;
}